

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O1

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,allocator<int> *allocator)

{
  DataBlock **ppDVar1;
  
  ppDVar1 = (DataBlock **)operator_new(0x40);
  (this->current_).arr_ = ppDVar1;
  (this->current_).begin_ = ppDVar1;
  (this->current_).end_ = ppDVar1;
  (this->current_).size_ = 0;
  (this->current_).allocSize_ = 8;
  ppDVar1 = (DataBlock **)operator_new(0x20);
  (this->small_).arr_ = ppDVar1;
  (this->small_).begin_ = ppDVar1;
  (this->small_).end_ = ppDVar1;
  (this->small_).size_ = 0;
  (this->small_).allocSize_ = 4;
  ppDVar1 = (DataBlock **)operator_new(0x80);
  (this->big_).arr_ = ppDVar1;
  (this->big_).begin_ = ppDVar1;
  (this->big_).end_ = ppDVar1;
  (this->big_).size_ = 0;
  (this->big_).allocSize_ = 0x10;
  return;
}

Assistant:

Deque(const Allocator &allocator = Allocator()) :
            small_(MIN_BUFFER_SIZE),
            current_(MIN_BUFFER_SIZE * 2),
            big_(MIN_BUFFER_SIZE * 4),
            allocator_(allocator)
    {}